

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O0

size_t __thiscall
proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage::ByteSizeLong
          (TestAllTypes_NestedMessage *this)

{
  int32_t iVar1;
  uint32_t *puVar2;
  size_t sVar3;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestAllTypes_NestedMessage *this_;
  TestAllTypes_NestedMessage *this_local;
  
  sStack_20 = 0;
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if (((*puVar2 & 1) != 0) && (iVar1 = _internal_bb(this), iVar1 != 0)) {
    iVar1 = _internal_bb(this);
    sStack_20 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar1);
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestAllTypes_NestedMessage::ByteSizeLong() const {
  const TestAllTypes_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // int32 bb = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (this_._internal_bb() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_bb());
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}